

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uscript_props.cpp
# Opt level: O2

UnicodeString *
uscript_getSampleUnicodeString_63(UnicodeString *__return_storage_ptr__,UScriptCode script)

{
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003edbf0;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  if (((uint)script < 0xb9) &&
     ((*(uint *)((anonymous_namespace)::SCRIPT_PROPS + (ulong)(uint)script * 4) & 0x1fffff) != 0)) {
    icu_63::UnicodeString::append
              (__return_storage_ptr__,
               *(uint *)((anonymous_namespace)::SCRIPT_PROPS + (ulong)(uint)script * 4) & 0x1fffff);
  }
  return __return_storage_ptr__;
}

Assistant:

U_COMMON_API icu::UnicodeString U_EXPORT2
uscript_getSampleUnicodeString(UScriptCode script) {
    icu::UnicodeString sample;
    int32_t sampleChar = getScriptProps(script) & 0x1fffff;
    if(sampleChar != 0) {
        sample.append(sampleChar);
    }
    return sample;
}